

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qo_manager.cc
# Opt level: O1

RC __thiscall
QO_Manager::CalcCondsForRel
          (QO_Manager *this,
          map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
          *attrStats,int relsInJoin,int relIdx,float *totalTuples,bool *useIdx,int *indexAttr,
          int *indexCond)

{
  bool bVar1;
  RC RVar2;
  int condIndex;
  long lVar3;
  long lVar4;
  int unused_1;
  int unused;
  RC local_60;
  int local_5c;
  map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_> *local_58;
  float *local_50;
  float local_44;
  bool *local_40;
  int local_38;
  int local_34;
  
  if (0 < this->nConds) {
    local_44 = 3.4028235e+38;
    lVar4 = 0;
    lVar3 = 0;
    local_58 = attrStats;
    local_50 = totalTuples;
    local_40 = useIdx;
    do {
      condIndex = (int)lVar3;
      bVar1 = UseCondition(this,relsInJoin,condIndex,relIdx);
      if (bVar1) {
        switch(*(undefined4 *)((long)&this->conds->op + lVar4)) {
        case 1:
          ApplyEQCond(this,local_58,condIndex,local_50);
          break;
        case 3:
        case 5:
          ApplyLTCond(this,local_58,condIndex,local_50);
          break;
        case 4:
        case 6:
          ApplyGTCond(this,local_58,condIndex,local_50);
        }
        local_5c = 0;
        RVar2 = CondToAttrIdx(this,condIndex,&local_5c,&local_34);
        if (RVar2 == 0) {
          bVar1 = true;
          RVar2 = local_60;
          if ((*(int *)((long)&this->conds->op + lVar4) == 1) &&
             (*(int *)((long)&this->conds->bRhsIsAttr + lVar4) == 0)) {
            if ((local_44 < (float)this->attrs[local_5c].numDistinct) &&
               (this->attrs[local_5c].indexNo != -1)) {
              *local_40 = true;
              RVar2 = CondToAttrIdx(this,condIndex,&local_5c,&local_38);
              bVar1 = RVar2 == 0;
              if (bVar1) {
                *indexCond = condIndex;
                *indexAttr = local_5c;
                local_44 = (float)this->attrs[local_5c].numDistinct;
                RVar2 = local_60;
              }
            }
          }
        }
        else {
          bVar1 = false;
        }
        local_60 = RVar2;
        if (!bVar1) {
          return local_60;
        }
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x38;
    } while (lVar3 < this->nConds);
  }
  return 0;
}

Assistant:

RC QO_Manager::CalcCondsForRel(map<int, attrStat> & attrStats, int relsInJoin, int relIdx,
  float &totalTuples, bool &useIdx, int& indexAttr, int& indexCond){
  RC rc = 0;
  // for index joins, it matters how many tuples have that particular
  // value for that attribute, so keep track of the number
  // of distinct values of the index attribute in indexTupleNum
  float indexTupleNum = FLT_MAX;
  // iterate through all conditions to see if they apply to this join
  for(int i=0; i < nConds; i++){
    if(UseCondition(relsInJoin, i, relIdx)){
      switch(conds[i].op){
        case EQ_OP : ApplyEQCond(attrStats, i, totalTuples); break;
        case LT_OP : ApplyLTCond(attrStats, i, totalTuples); break;
        case GT_OP : ApplyGTCond(attrStats, i, totalTuples); break;
        case LE_OP : ApplyLTCond(attrStats, i, totalTuples); break;
        case GE_OP : ApplyGTCond(attrStats, i, totalTuples); break;
        default: break;
      }
      int unused; 
      int attributeNum = 0;
      if((rc = CondToAttrIdx(i, attributeNum, unused)))
        return (rc);
      // if this is an equality condition, and there is an index on one of
      // the attributes, make this the index join attribute if the number of
      // distinct tuples is greater than the previous join attribute candidate
      if(conds[i].op == EQ_OP && !conds[i].bRhsIsAttr && ((float)attrs[attributeNum].numDistinct) > indexTupleNum
        && (attrs[attributeNum].indexNo != -1)){
        // update return values to reflect this index join
        useIdx = true;
        int unused;
        if((rc = CondToAttrIdx(i, attributeNum, unused)))
          return (rc);
        indexCond = i;
        indexAttr = attributeNum;
        indexTupleNum = ((float)attrs[indexAttr].numDistinct);
      }
    }
  }
  return (0);
}